

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O1

void Saig_ManFoldConstrTest(Aig_Man_t *pAig)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  Aig_Man_t *pAig_00;
  Vec_Int_t *vConstrs;
  int *__ptr;
  int *piVar4;
  Aig_Man_t *pMan;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  
  pAig_00 = Saig_ManDupUnfoldConstrs(pAig);
  uVar1 = pAig_00->nTruePos;
  uVar7 = (ulong)uVar1;
  vConstrs = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar3 = uVar1;
  }
  vConstrs->nSize = 0;
  vConstrs->nCap = uVar3;
  if (uVar3 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)(int)uVar3 << 2);
  }
  vConstrs->pArray = __ptr;
  vConstrs->nSize = uVar1;
  bVar9 = 0 < (int)uVar1;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      __ptr[uVar5] = (int)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
    uVar5 = 0;
    if (0 < (int)uVar1) {
      if (*__ptr == 0) {
        bVar9 = true;
        uVar5 = 0;
      }
      else {
        uVar6 = 0;
        do {
          if (uVar7 - 1 == uVar6) {
            bVar9 = false;
            uVar5 = (ulong)uVar1;
            goto LAB_006d7fe1;
          }
          uVar5 = uVar6 + 1;
          lVar2 = uVar6 + 1;
          uVar6 = uVar5;
        } while (__ptr[lVar2] != 0);
        bVar9 = uVar5 < uVar7;
      }
    }
  }
LAB_006d7fe1:
  if ((uint)uVar5 != uVar1) {
    if (!bVar9) {
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
    }
    uVar3 = (uint)uVar5 + 1;
    if ((int)uVar3 < (int)uVar1) {
      piVar4 = __ptr + uVar3;
      do {
        iVar8 = (int)uVar5;
        __ptr[uVar5 & 0xffffffff] = *piVar4;
        piVar4 = piVar4 + 1;
        uVar5 = (ulong)(iVar8 + 1);
      } while (iVar8 + 2 < (int)uVar1);
    }
    vConstrs->nSize = uVar1 - 1;
  }
  pMan = Saig_ManDupFoldConstrs(pAig_00,vConstrs);
  if (__ptr != (int *)0x0) {
    free(__ptr);
    vConstrs->pArray = (int *)0x0;
  }
  free(vConstrs);
  Ioa_WriteAiger(pMan,"test.aig",0,0);
  Aig_ManStop(pAig_00);
  Aig_ManStop(pMan);
  return;
}

Assistant:

void Saig_ManFoldConstrTest( Aig_Man_t * pAig )
{
    Aig_Man_t * pAig1, * pAig2;
    Vec_Int_t * vConstrs;
    // unfold constraints
    pAig1 = Saig_ManDupUnfoldConstrs( pAig );
    // create the constraint list
    vConstrs = Vec_IntStartNatural( Saig_ManPoNum(pAig1) );
    Vec_IntRemove( vConstrs, 0 );
    // fold constraints back
    pAig2 = Saig_ManDupFoldConstrs( pAig1, vConstrs );
    Vec_IntFree( vConstrs );
    // compare the two AIGs
    Ioa_WriteAiger( pAig2, "test.aig", 0, 0 );
    Aig_ManStop( pAig1 );
    Aig_ManStop( pAig2 );
}